

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

void highbd_variance64(uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int w,int h,uint64_t *sse,
                      int64_t *sum)

{
  long lVar1;
  uint64_t uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  int j;
  ulong uVar8;
  int32_t lsum;
  int iVar9;
  
  lVar4 = (long)a8 * 2;
  lVar1 = (long)b8 * 2;
  uVar6 = 0;
  uVar5 = (ulong)(uint)w;
  if (w < 1) {
    uVar5 = uVar6;
  }
  if (h < 1) {
    h = 0;
  }
  uVar2 = 0;
  for (iVar3 = 0; iVar3 != h; iVar3 = iVar3 + 1) {
    iVar9 = 0;
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      iVar7 = (uint)*(ushort *)(lVar4 + uVar8 * 2) - (uint)*(ushort *)(lVar1 + uVar8 * 2);
      iVar9 = iVar9 + iVar7;
      uVar2 = uVar2 + (uint)(iVar7 * iVar7);
    }
    uVar6 = uVar6 + (long)iVar9;
    lVar1 = lVar1 + (long)b_stride * 2;
    lVar4 = lVar4 + (long)a_stride * 2;
  }
  *sum = uVar6;
  *sse = uVar2;
  return;
}

Assistant:

static void highbd_variance64(const uint8_t *a8, int a_stride,
                              const uint8_t *b8, int b_stride, int w, int h,
                              uint64_t *sse, int64_t *sum) {
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  int64_t tsum = 0;
  uint64_t tsse = 0;
  for (int i = 0; i < h; ++i) {
    int32_t lsum = 0;
    for (int j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      lsum += diff;
      tsse += (uint32_t)(diff * diff);
    }
    tsum += lsum;
    a += a_stride;
    b += b_stride;
  }
  *sum = tsum;
  *sse = tsse;
}